

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.hpp
# Opt level: O3

void __thiscall Diligent::DeviceContextGLImpl::BindInfo::Invalidate(BindInfo *this)

{
  long lVar1;
  long lVar2;
  RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl> local_150 [4];
  long local_110 [17];
  undefined8 uStack_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined4 local_70;
  undefined8 local_6c;
  undefined8 uStack_64;
  undefined8 local_5c;
  undefined8 uStack_54;
  undefined8 local_4c;
  undefined8 uStack_44;
  undefined8 local_3c;
  undefined8 uStack_34;
  
  lVar2 = 0;
  memset(local_150,0,0x124);
  (this->super_CommittedShaderResources).ResourceCaches._M_elems[0] = (ShaderResourceCacheGL *)0x0;
  (this->super_CommittedShaderResources).ResourceCaches._M_elems[1] = (ShaderResourceCacheGL *)0x0;
  (this->super_CommittedShaderResources).ResourceCaches._M_elems[2] = (ShaderResourceCacheGL *)0x0;
  (this->super_CommittedShaderResources).ResourceCaches._M_elems[3] = (ShaderResourceCacheGL *)0x0;
  (this->super_CommittedShaderResources).ResourceCaches._M_elems[4] = (ShaderResourceCacheGL *)0x0;
  (this->super_CommittedShaderResources).ResourceCaches._M_elems[5] = (ShaderResourceCacheGL *)0x0;
  (this->super_CommittedShaderResources).ResourceCaches._M_elems[6] = (ShaderResourceCacheGL *)0x0;
  (this->super_CommittedShaderResources).ResourceCaches._M_elems[7] = (ShaderResourceCacheGL *)0x0;
  do {
    lVar1 = *(long *)((long)local_110 + lVar2);
    if (*(long *)((long)&(this->super_CommittedShaderResources).SRBs._M_elems[0].m_pRefCounters +
                 lVar2) != lVar1) {
      RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl>::Release
                ((RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl> *)
                 ((long)&(this->super_CommittedShaderResources).SRBs._M_elems[0].m_pRefCounters +
                 lVar2));
      *(undefined8 *)
       ((long)&(this->super_CommittedShaderResources).SRBs._M_elems[0].m_pObject + lVar2) =
           *(undefined8 *)((long)local_110 + lVar2 + 8);
      *(long *)((long)&(this->super_CommittedShaderResources).SRBs._M_elems[0].m_pRefCounters +
               lVar2) = lVar1;
      *(undefined8 *)((long)local_110 + lVar2) = 0;
      *(undefined8 *)((long)local_110 + lVar2 + 8) = 0;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0x80);
  (this->super_CommittedShaderResources).ResourcesValidated = (bool)(undefined1)local_70;
  (this->super_CommittedShaderResources).ActiveSRBMask = local_70._1_1_;
  (this->super_CommittedShaderResources).StaleSRBMask = local_70._2_1_;
  (this->super_CommittedShaderResources).DynamicSRBMask = local_70._3_1_;
  *(undefined8 *)((this->super_CommittedShaderResources).CacheRevisions._M_elems + 4) = local_80;
  *(undefined8 *)((this->super_CommittedShaderResources).CacheRevisions._M_elems + 6) = uStack_78;
  *(long *)(this->super_CommittedShaderResources).CacheRevisions._M_elems = local_110[0x10];
  *(undefined8 *)((this->super_CommittedShaderResources).CacheRevisions._M_elems + 2) = uStack_88;
  *(undefined8 *)&(this->super_CommittedShaderResources).field_0xe4 = local_6c;
  *(undefined8 *)&this->field_0xec = uStack_64;
  *(undefined8 *)&this->field_0xf4 = local_5c;
  *(undefined8 *)&this->field_0xfc = uStack_54;
  *(undefined8 *)&this->field_0x104 = local_4c;
  *(undefined8 *)&this->field_0x10c = uStack_44;
  *(undefined8 *)&this->field_0x114 = local_3c;
  *(undefined8 *)&this->field_0x11c = uStack_34;
  lVar2 = 0xb0;
  do {
    RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl>::Release
              ((RefCntWeakPtr<Diligent::ShaderResourceBindingGLImpl> *)
               ((long)&local_150[0].m_pRefCounters + lVar2));
    lVar2 = lVar2 + -0x10;
  } while (lVar2 != 0x30);
  return;
}

Assistant:

void Invalidate()
        {
            *this = {};
        }